

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O0

MtrNode * Cudd_MakeZddTreeNode(DdManager *dd,uint low,uint size,uint type)

{
  MtrHalfWord local_44;
  uint local_40;
  MtrNode *pMStack_38;
  uint level;
  MtrNode *tree;
  MtrNode *group;
  uint type_local;
  uint size_local;
  uint low_local;
  DdManager *dd_local;
  
  local_40 = low;
  if (low < (uint)dd->sizeZ) {
    local_40 = dd->permZ[low];
  }
  if ((local_40 + size) - 1 < 0x80000000) {
    pMStack_38 = dd->treeZ;
    if (pMStack_38 == (MtrNode *)0x0) {
      pMStack_38 = Mtr_InitGroupTree(0,dd->sizeZ);
      dd->treeZ = pMStack_38;
      if (pMStack_38 == (MtrNode *)0x0) {
        return (MtrNode *)0x0;
      }
      pMStack_38->index = *dd->invpermZ;
    }
    if (pMStack_38->size < local_40 + size) {
      local_44 = local_40 + size;
    }
    else {
      local_44 = pMStack_38->size;
    }
    pMStack_38->size = local_44;
    dd_local = (DdManager *)Mtr_MakeGroup(pMStack_38,local_40,size,type);
    if (dd_local == (DdManager *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(uint *)((long)&(dd_local->sentinel).next + 4) = low;
    }
  }
  else {
    dd_local = (DdManager *)0x0;
  }
  return (MtrNode *)dd_local;
}

Assistant:

MtrNode *
Cudd_MakeZddTreeNode(
  DdManager * dd /* manager */,
  unsigned int  low /* index of the first group variable */,
  unsigned int  size /* number of variables in the group */,
  unsigned int  type /* MTR_DEFAULT or MTR_FIXED */)
{
    MtrNode *group;
    MtrNode *tree;
    unsigned int level;

    /* If the variable does not exist yet, the position is assumed to be
    ** the same as the index. Therefore, applications that rely on
    ** Cudd_bddNewVarAtLevel or Cudd_addNewVarAtLevel to create new
    ** variables have to create the variables before they group them.
    */
    level = (low < (unsigned int) dd->sizeZ) ? dd->permZ[low] : low;

    if (level + size - 1> (int) MTR_MAXHIGH)
        return(NULL);

    /* If the tree does not exist yet, create it. */
    tree = dd->treeZ;
    if (tree == NULL) {
        dd->treeZ = tree = Mtr_InitGroupTree(0, dd->sizeZ);
        if (tree == NULL)
            return(NULL);
        tree->index = dd->invpermZ[0];
    }

    /* Extend the upper bound of the tree if necessary. This allows the
    ** application to create groups even before the variables are created.
    */
    tree->size = ddMax(tree->size, level + size);

    /* Create the group. */
    group = Mtr_MakeGroup(tree, level, size, type);
    if (group == NULL)
        return(NULL);

    /* Initialize the index field to the index of the variable currently
    ** in position low. This field will be updated by the reordering
    ** procedure to provide a handle to the group once it has been moved.
    */
    group->index = (MtrHalfWord) low;

    return(group);

}